

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# target.c
# Opt level: O0

char * stumpless_get_target_type_string(stumpless_target_type target_type)

{
  stumpless_target_type sVar1;
  size_t upper_bound;
  char *pcStack_10;
  stumpless_target_type target_type_local;
  
  sVar1 = cap_size_t_to_int(10);
  if (target_type < sVar1) {
    pcStack_10 = target_type_enum_to_string[target_type];
  }
  else {
    pcStack_10 = "NO_SUCH_TARGET_TYPE";
  }
  return pcStack_10;
}

Assistant:

const char *
stumpless_get_target_type_string( enum stumpless_target_type target_type ){
  size_t upper_bound;

  upper_bound = sizeof( target_type_enum_to_string ) / sizeof( const char * );
  if ( target_type >= 0 && target_type < cap_size_t_to_int( upper_bound ) ) {
    return target_type_enum_to_string[target_type];
  } else {
    return "NO_SUCH_TARGET_TYPE";
  }
}